

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

uint64_t __thiscall spvtools::opt::analysis::Constant::GetZeroExtendedValue(Constant *this)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  ScalarConstant *this_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  char *__assertion;
  undefined4 extraout_var_00;
  
  iVar2 = (*this->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    __assertion = "int_type != nullptr";
    uVar1 = 0x6b;
  }
  else {
    uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x24);
    if (uVar1 < 0x41) {
      iVar2 = (*this->_vptr_Constant[0xe])(this);
      this_00 = (ScalarConstant *)CONCAT44(extraout_var_00,iVar2);
      if (this_00 == (ScalarConstant *)0x0) {
        iVar2 = (*this->_vptr_Constant[0x16])(this);
        if (CONCAT44(extraout_var_01,iVar2) == 0) {
          __assertion = "AsNullConstant() && \"Must be an integer constant.\"";
          uVar1 = 0x77;
          goto LAB_004c8852;
        }
        uVar4 = 0;
      }
      else {
        if (0x20 < uVar1) {
          uVar4 = ScalarConstant::GetU64BitValue(this_00);
          return uVar4;
        }
        uVar3 = ScalarConstant::GetU32BitValue(this_00);
        uVar4 = (uint64_t)uVar3;
      }
      return uVar4;
    }
    __assertion = "width <= 64";
    uVar1 = 0x6d;
  }
LAB_004c8852:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,uVar1,"uint64_t spvtools::opt::analysis::Constant::GetZeroExtendedValue() const");
}

Assistant:

uint64_t Constant::GetZeroExtendedValue() const {
  const auto* int_type = type()->AsInteger();
  assert(int_type != nullptr);
  const auto width = int_type->width();
  assert(width <= 64);

  uint64_t value = 0;
  if (const IntConstant* ic = AsIntConstant()) {
    if (width <= 32) {
      value = ic->GetU32BitValue();
    } else {
      value = ic->GetU64BitValue();
    }
  } else {
    assert(AsNullConstant() && "Must be an integer constant.");
  }
  return value;
}